

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O2

void __thiscall
CCheckQueue<MemoryCheck>::Add
          (CCheckQueue<MemoryCheck> *this,
          vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *vChecks)

{
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  unique_lock<std::mutex> uStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((vChecks->
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (vChecks->
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&uStack_28,
               (AnnotatedMixin<std::mutex> *)this,"m_mutex",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/checkqueue.h"
               ,0xa3,false);
    std::vector<MemoryCheck,std::allocator<MemoryCheck>>::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<MemoryCheck*,std::vector<MemoryCheck,std::allocator<MemoryCheck>>>>,void>
              ((vector<MemoryCheck,std::allocator<MemoryCheck>> *)(this + 0x88),
               *(MemoryCheck **)(this + 0x90),
               (move_iterator<__gnu_cxx::__normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>_>
                )(vChecks->
                 super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                 )._M_impl.super__Vector_impl_data._M_start,
               (move_iterator<__gnu_cxx::__normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>_>
                )(vChecks->
                 super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
    *(int *)(this + 0xac) =
         *(int *)(this + 0xac) +
         (*(int *)&(vChecks->
                   super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
         *(int *)&(vChecks->
                  super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                  )._M_impl.super__Vector_impl_data._M_start);
    std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
    if ((long)(vChecks->
              super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(vChecks->
              super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
              )._M_impl.super__Vector_impl_data._M_start == 1) {
      std::condition_variable::notify_one();
    }
    else {
      std::condition_variable::notify_all();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        if (vChecks.empty()) {
            return;
        }

        {
            LOCK(m_mutex);
            queue.insert(queue.end(), std::make_move_iterator(vChecks.begin()), std::make_move_iterator(vChecks.end()));
            nTodo += vChecks.size();
        }

        if (vChecks.size() == 1) {
            m_worker_cv.notify_one();
        } else {
            m_worker_cv.notify_all();
        }
    }